

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O3

void __thiscall
RasterizerA3<32U>::_addLine<long>(RasterizerA3<32U> *this,long x0,long y0,long x1,long y1)

{
  int32_t *piVar1;
  ulong *puVar2;
  BitWord *pBVar3;
  Cell *pCVar4;
  Cell *pCVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong *__s;
  int iVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  bool bVar39;
  Cell CVar40;
  Cell CVar41;
  Cell CVar42;
  Cell CVar43;
  Cell CVar44;
  ulong local_f0;
  ulong local_e0;
  long local_c0;
  long local_a0;
  int local_98;
  BitWord *local_80;
  
  uVar8 = y1 - y0;
  if (uVar8 != 0) {
    uVar17 = x1 - x0;
    uVar25 = -uVar17;
    if (0 < (long)uVar17) {
      uVar25 = uVar17;
    }
    uVar17 = -uVar8;
    if (0 < (long)uVar8) {
      uVar17 = uVar8;
    }
    if (x1 < x0) {
      iVar28 = -1;
      uVar32 = y1;
      local_e0 = x1;
      local_a0 = x0;
    }
    else {
      iVar28 = 1;
      uVar32 = y0;
      y0 = y1;
      local_e0 = x0;
      local_a0 = x1;
    }
    if (y0 < (long)uVar32) {
      uVar31 = uVar32 ^ 0xff;
      lVar27 = (ulong)((char)uVar31 != -1) * 0x200;
      uVar32 = (uVar31 + lVar27) - 0x1ff;
      y0 = (uVar17 + lVar27 + uVar31) - 0x1ff;
      iVar28 = -iVar28;
      iVar15 = -1;
    }
    else {
      iVar15 = 1;
    }
    local_f0 = local_e0 >> 8;
    uVar20 = (uint)local_e0 & 0xff;
    uVar31 = (ulong)uVar20;
    uVar38 = uVar32 >> 8;
    uVar36 = (uint)(uVar32 >> 8);
    iVar26 = (int)((ulong)y0 >> 8) - uVar36;
    uVar29 = (uint)(local_e0 >> 8);
    if ((int)((int)uVar25 + uVar20) < 0x101 && iVar26 == 0) {
      uVar30 = (this->_yBounds).start;
      uVar35 = (this->_yBounds).end;
      if ((int)uVar36 <= (int)uVar30) {
        uVar30 = uVar36;
      }
      (this->_yBounds).start = uVar30;
      if ((int)uVar35 <= (int)uVar36) {
        uVar35 = uVar36;
      }
      (this->_yBounds).end = uVar35;
      this->_bits
      [(long)(int)uVar36 * this->_bitStride + (ulong)((uint)(local_e0 >> 0x13) & 0x1fffff)] =
           this->_bits
           [(long)(int)uVar36 * this->_bitStride + (ulong)((uint)(local_e0 >> 0x13) & 0x1fffff)] |
           1L << ((byte)(local_e0 >> 0xd) & 0x3f);
      if (((int)uVar29 < 0) || ((this->super_CellRasterizer).super_Rasterizer._width <= (int)uVar29)
         ) goto LAB_0010f865;
      if (((int)uVar36 < 0) ||
         ((this->super_CellRasterizer).super_Rasterizer._height <= (int)uVar36)) {
LAB_0010f884:
        __assert_fail("y >= 0 && y < _height",
                      "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                      ,0x20,"void RasterizerA3<32>::_mergeCell(int, int, int, int) [N = 32]");
      }
      lVar27 = (uVar38 & 0x7fffffff) * this->_cellStride;
      CVar44 = this->_cells[lVar27 + (local_f0 & 0x7fffffff)];
      CVar43.cover = (int)uVar8 + CVar44.cover;
      CVar43.area = ((int)uVar25 + uVar20 * 2) * (int)uVar8 + CVar44.area;
      this->_cells[lVar27 + (local_f0 & 0x7fffffff)] = CVar43;
    }
    else {
      uVar30 = (uint)uVar32 & 0xff;
      uVar34 = (uint)y0 & 0xff;
      uVar22 = ((iVar26 + 1) - (uint)((y0 & 0xffU) == 0)) * iVar15 + uVar36;
      uVar35 = uVar36;
      if (uVar22 < uVar36) {
        uVar35 = uVar22;
      }
      if (uVar36 < uVar22) {
        uVar36 = uVar22;
      }
      uVar24 = (this->_yBounds).start;
      uVar7 = (this->_yBounds).end;
      if ((int)uVar24 < (int)uVar35) {
        uVar35 = uVar24;
      }
      (this->_yBounds).start = uVar35;
      if ((int)uVar36 < (int)uVar7) {
        uVar36 = uVar7;
      }
      (this->_yBounds).end = uVar36;
      if (x1 != x0) {
        uVar9 = (uVar25 << 8) / uVar17;
        uVar18 = (uVar25 << 8) % uVar17;
        uVar19 = (uVar17 << 8) % uVar25;
        uVar10 = 0;
        uVar8 = uVar25;
        uVar36 = uVar34;
        if (iVar26 != 0) {
          uVar10 = (0x100 - uVar30) * uVar25;
          uVar8 = uVar10 / uVar17;
          uVar10 = uVar10 % uVar17;
          uVar36 = 0x100;
        }
        if (uVar29 == (uint)((ulong)local_a0 >> 8)) {
          uVar11 = 0;
          uVar12 = uVar17;
        }
        else {
          uVar11 = (0x100 - uVar20) * uVar17;
          uVar12 = uVar11 / uVar25;
          uVar11 = uVar11 % uVar25;
        }
        lVar27 = uVar11 - (uVar25 >> 1);
        local_c0 = uVar10 - (uVar17 >> 1);
        local_98 = (int)((uVar17 << 8) / uVar25);
        if (uVar25 <= uVar17) {
          uVar20 = (int)uVar12 + (uint)uVar32;
          iVar23 = 1;
LAB_0010f0f2:
          pBVar3 = this->_bits;
          pCVar4 = this->_cells;
          lVar14 = (long)(int)uVar38;
          iVar6 = uVar22 - (iVar15 + (int)uVar38);
          do {
            iVar16 = (int)uVar31;
            uVar29 = (int)uVar8 + iVar16;
            iVar37 = (int)local_f0;
            if ((int)uVar29 < 0x101) {
              pBVar3[this->_bitStride * lVar14 + (local_f0 >> 0xb & 0x1fffff)] =
                   pBVar3[this->_bitStride * lVar14 + (local_f0 >> 0xb & 0x1fffff)] |
                   1L << ((byte)(local_f0 >> 5) & 0x3f);
              if ((iVar37 < 0) || ((this->super_CellRasterizer).super_Rasterizer._width <= iVar37))
              goto LAB_0010f865;
              if ((lVar14 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= lVar14))
              goto LAB_0010f884;
              iVar13 = (uVar36 - uVar30) * iVar28;
              lVar33 = this->_cellStride * lVar14;
              CVar40.cover = iVar13 + pCVar4[lVar33 + (local_f0 & 0xffffffff)].cover;
              CVar40.area = (iVar16 + uVar29) * iVar13 +
                            pCVar4[lVar33 + (local_f0 & 0xffffffff)].area;
              pCVar4[lVar33 + (local_f0 & 0xffffffff)] = CVar40;
              if (uVar29 == 0x100) {
                local_f0 = (ulong)(iVar37 + 1);
                uVar29 = 0;
                goto LAB_0010f2e6;
              }
              uVar31 = (ulong)uVar29;
            }
            else {
              pBVar3[this->_bitStride * lVar14 + (local_f0 >> 0xb & 0x1fffff)] =
                   pBVar3[this->_bitStride * lVar14 + (local_f0 >> 0xb & 0x1fffff)] |
                   1L << ((byte)(local_f0 >> 5) & 0x3f);
              if ((iVar37 < 0) || ((this->super_CellRasterizer).super_Rasterizer._width <= iVar37))
              goto LAB_0010f865;
              if ((lVar14 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= lVar14))
              goto LAB_0010f884;
              uVar20 = uVar20 & 0xff;
              iVar13 = (uVar20 - uVar30) * iVar28;
              lVar33 = this->_cellStride * lVar14;
              CVar44.cover = iVar13 + pCVar4[lVar33 + (local_f0 & 0xffffffff)].cover;
              CVar44.area = (iVar16 + 0x100) * iVar13 +
                            pCVar4[lVar33 + (local_f0 & 0xffffffff)].area;
              pCVar4[lVar33 + (local_f0 & 0xffffffff)] = CVar44;
              uVar35 = iVar37 + 1;
              local_f0 = (ulong)uVar35;
              pBVar3[this->_bitStride * lVar14 + (ulong)(uVar35 >> 0xb)] =
                   pBVar3[this->_bitStride * lVar14 + (ulong)(uVar35 >> 0xb)] |
                   1L << ((byte)(uVar35 >> 5) & 0x3f);
              if ((this->super_CellRasterizer).super_Rasterizer._width <= (int)uVar35)
              goto LAB_0010f865;
              if ((this->super_CellRasterizer).super_Rasterizer._height <= lVar14)
              goto LAB_0010f884;
              uVar29 = uVar29 & 0xff;
              iVar16 = (uVar36 - uVar20) * iVar28;
              lVar33 = this->_cellStride * lVar14;
              CVar41.cover = iVar16 + pCVar4[lVar33 + local_f0].cover;
              CVar41.area = iVar16 * uVar29 + pCVar4[lVar33 + local_f0].area;
              pCVar4[lVar33 + local_f0] = CVar41;
LAB_0010f2e6:
              uVar31 = (ulong)uVar29;
              uVar20 = uVar20 + local_98;
              lVar27 = lVar27 + uVar19;
              if (-1 < lVar27) {
                lVar27 = lVar27 - uVar25;
                uVar20 = uVar20 + 1;
              }
            }
            iVar23 = iVar23 + -1;
            if (iVar23 != 0) goto LAB_0010f37d;
            if (iVar6 == 0) {
              return;
            }
            if (1 < iVar26) goto LAB_0010f35f;
            lVar14 = lVar14 + iVar15;
            uVar8 = local_a0 - (uVar31 + (uint)((int)local_f0 << 8));
            iVar6 = iVar6 - iVar15;
            uVar30 = 0;
            uVar36 = uVar34;
            iVar23 = iVar26;
            iVar26 = 1;
          } while( true );
        }
        uVar29 = uVar30 + (int)uVar12;
        iVar23 = 1;
        if ((int)((int)uVar8 + uVar20) < 0x101) {
          local_e0 = local_e0 + uVar8;
          iVar6 = (uVar36 - uVar30) * iVar28;
          iVar16 = ((int)uVar8 + uVar20 * 2) * iVar6;
          local_80 = this->_bits;
          iVar23 = 0;
          goto LAB_0010f3f6;
        }
        while( true ) {
          uVar35 = (uint)uVar12;
          local_e0 = local_e0 + uVar8;
          uVar30 = (uint)local_f0;
          uVar20 = (uint)(local_e0 >> 8);
          if (uVar30 == uVar20) {
            __assert_fail("ex0 != ex1",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e7,
                          "void RasterizerA3<32>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 32, Fixed = long]"
                         );
          }
          bVar39 = (local_e0 & 0xff) != 0;
          uVar24 = 0x100;
          if (bVar39) {
            uVar24 = (uint)local_e0 & 0xff;
          }
          uVar20 = bVar39 + uVar20;
          iVar6 = ((int)uVar31 + 0x100) * uVar35;
          local_80 = this->_bits;
          uVar8 = local_f0 >> 5 & 0x7ffffff;
          uVar7 = (uint)uVar8;
          uVar21 = ((uVar20 >> 5) - uVar7) + 1;
          uVar32 = (ulong)uVar21;
          iVar16 = (int)uVar38;
          if (uVar21 != 0) {
            lVar14 = (long)iVar16 * this->_bitStride;
            uVar8 = uVar8 >> 6;
            uVar7 = uVar7 & 0x3f;
            uVar31 = 0x40 - (ulong)uVar7;
            if (uVar32 <= uVar31) {
              uVar31 = uVar32;
            }
            puVar2 = local_80 + lVar14 + uVar8;
            __s = puVar2 + 1;
            *puVar2 = *puVar2 | (0xffffffffffffffffU >> (-(char)uVar31 & 0x3fU)) << (sbyte)uVar7;
            uVar10 = uVar32 - uVar31;
            if (0x3f < uVar10) {
              uVar32 = (uVar32 - uVar31) - 0x40;
              uVar31 = uVar32 >> 6;
              memset(__s,0xff,uVar31 * 8 + 8);
              uVar10 = (ulong)((uint)uVar32 & 0x3f);
              __s = local_80 + lVar14 + uVar8 + uVar31 + 2;
            }
            if (uVar10 != 0) {
              *__s = *__s | 0xffffffffffffffffU >> (-(char)uVar10 & 0x3fU);
            }
          }
          uVar20 = uVar20 - 1;
          if (uVar30 != uVar20) {
            pCVar4 = this->_cells;
            lVar14 = this->_cellStride * (uVar38 & 0xffffffff);
            local_f0 = local_f0 & 0xffffffff;
            do {
              if (((int)uVar30 < 0) ||
                 ((this->super_CellRasterizer).super_Rasterizer._width <= (int)local_f0))
              goto LAB_0010f865;
              if ((iVar16 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= iVar16))
              goto LAB_0010f884;
              pCVar5 = pCVar4 + lVar14 + local_f0;
              pCVar5->cover = pCVar5->cover + (int)uVar12 * iVar28;
              piVar1 = &pCVar4[lVar14 + local_f0].area;
              *piVar1 = *piVar1 + iVar6 * iVar28;
              lVar33 = lVar27 + uVar19;
              uVar8 = 0;
              if (-1 < lVar33) {
                uVar8 = uVar25;
              }
              lVar27 = lVar33 - uVar8;
              uVar35 = (uint)(-1 < lVar33) + local_98;
              uVar12 = (ulong)uVar35;
              uVar29 = uVar29 + uVar35;
              iVar6 = uVar35 * 0x100;
              local_f0 = local_f0 + 1;
            } while (uVar20 != local_f0);
            local_f0 = (ulong)uVar20;
          }
          if (((int)local_f0 < 0) ||
             ((this->super_CellRasterizer).super_Rasterizer._width <= (int)local_f0)) break;
          if ((iVar16 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= iVar16))
          goto LAB_0010f884;
          iVar6 = (uVar36 - uVar29) + uVar35;
          lVar14 = (uVar38 & 0xffffffff) * this->_cellStride;
          pCVar5 = this->_cells;
          pCVar4 = pCVar5 + lVar14 + (local_f0 & 0xffffffff);
          pCVar4->cover = pCVar4->cover + iVar6 * iVar28;
          piVar1 = &pCVar5[lVar14 + (local_f0 & 0xffffffff)].area;
          *piVar1 = *piVar1 + uVar24 * iVar28 * iVar6;
          if ((local_e0 & 0xff) == 0) {
            uVar29 = uVar29 + local_98;
            lVar27 = lVar27 + uVar19;
            if (-1 < lVar27) {
              lVar27 = lVar27 - uVar25;
              uVar29 = uVar29 + 1;
            }
          }
          uVar38 = (ulong)(uint)(iVar16 + iVar15);
          iVar23 = iVar23 + -1;
          if (iVar23 == 0) {
            if (iVar16 + iVar15 == uVar22) {
              return;
            }
            do {
              iVar23 = iVar26;
              if (1 < iVar23) {
                iVar23 = iVar23 + -1;
                uVar36 = 0x100;
                iVar26 = 1;
                break;
              }
              uVar8 = local_a0 - local_e0;
              local_f0 = local_e0 >> 8;
              uVar31 = local_e0 & 0xff;
              uVar20 = (uint)uVar31;
              iVar26 = 1;
              uVar36 = uVar34;
              if (0x100 < (int)((int)uVar8 + uVar20)) goto LAB_0010f4e2;
              iVar6 = uVar34 * iVar28;
              iVar16 = ((int)uVar8 + uVar20 * 2) * iVar6;
              iVar23 = iVar23 + -1;
              iVar26 = 1;
LAB_0010f3f6:
              iVar37 = (int)uVar38;
              local_80[(long)iVar37 * this->_bitStride + (local_f0 >> 0xb & 0x1fffff)] =
                   local_80[(long)iVar37 * this->_bitStride + (local_f0 >> 0xb & 0x1fffff)] |
                   1L << ((byte)(local_f0 >> 5) & 0x3f);
              if (((int)local_f0 < 0) ||
                 ((this->super_CellRasterizer).super_Rasterizer._width <= (int)local_f0))
              goto LAB_0010f865;
              if ((iVar37 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= iVar37))
              goto LAB_0010f884;
              lVar14 = (uVar38 & 0xffffffff) * this->_cellStride;
              pCVar5 = this->_cells;
              pCVar4 = pCVar5 + lVar14 + (local_f0 & 0xffffffff);
              pCVar4->cover = pCVar4->cover + iVar6;
              piVar1 = &pCVar5[lVar14 + (local_f0 & 0xffffffff)].area;
              *piVar1 = *piVar1 + iVar16;
              uVar38 = (ulong)(uint)(iVar37 + iVar15);
              if (iVar37 + iVar15 == uVar22) {
                return;
              }
              if (uVar20 + (int)uVar8 == 0x100) {
                uVar29 = uVar29 + local_98;
                lVar27 = lVar27 + uVar19;
                if (-1 < lVar27) {
                  lVar27 = lVar27 - uVar25;
                  uVar29 = uVar29 + 1;
                }
              }
            } while (iVar23 == 0);
          }
          lVar14 = local_c0 + uVar18;
          uVar8 = 0;
          if (-1 < lVar14) {
            uVar8 = uVar17;
          }
          local_c0 = lVar14 - uVar8;
          uVar8 = (-1 < lVar14) + uVar9;
          local_f0 = local_e0 >> 8;
          uVar31 = local_e0 & 0xff;
LAB_0010f4e2:
          uVar29 = uVar29 - 0x100;
          uVar12 = (ulong)uVar29;
          if (0x100 < uVar29) {
            __assert_fail("cover >= 0 && cover <= 256",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e0,
                          "void RasterizerA3<32>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 32, Fixed = long]"
                         );
          }
        }
LAB_0010f865:
        __assert_fail("x >= 0 && x < _width",
                      "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                      ,0x1f,"void RasterizerA3<32>::_mergeCell(int, int, int, int) [N = 32]");
      }
      uVar8 = uVar8 & 0xffffffff;
      if (0 < iVar26) {
        uVar8 = (ulong)((0x100 - uVar30) * iVar28);
      }
      pBVar3 = this->_bits;
      iVar23 = 1;
      while( true ) {
        pCVar4 = this->_cells;
        iVar6 = (int)uVar38;
        uVar38 = (ulong)iVar6;
        iVar6 = uVar22 - iVar6;
        do {
          puVar2 = (ulong *)((long)pBVar3 +
                            this->_bitStride * uVar38 * 8 +
                            (ulong)(((uint)(local_e0 >> 0x13) & 0x1fffff) << 3));
          *puVar2 = *puVar2 | 1L << ((byte)(local_e0 >> 0xd) & 0x3f);
          if (((int)uVar29 < 0) ||
             ((this->super_CellRasterizer).super_Rasterizer._width <= (int)uVar29))
          goto LAB_0010f865;
          if (((long)uVar38 < 0) ||
             ((long)(this->super_CellRasterizer).super_Rasterizer._height <= (long)uVar38))
          goto LAB_0010f884;
          lVar27 = this->_cellStride * uVar38;
          CVar44 = pCVar4[(ulong)(uVar29 & 0x7fffffff) + lVar27];
          CVar42.cover = CVar44.cover + (int)uVar8;
          CVar42.area = CVar44.area + uVar20 * 2 * (int)uVar8;
          pCVar4[(ulong)(uVar29 & 0x7fffffff) + lVar27] = CVar42;
          uVar38 = uVar38 + (long)iVar15;
          iVar6 = iVar6 - iVar15;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        if (iVar6 == 0) break;
        uVar36 = uVar34 * iVar28;
        if (1 < iVar26) {
          uVar36 = iVar28 << 8;
        }
        uVar8 = (ulong)uVar36;
        iVar23 = iVar26 - (uint)(1 < iVar26);
        iVar26 = 1;
      }
    }
  }
  return;
LAB_0010f35f:
  iVar23 = iVar26 + -1;
  uVar30 = 0;
  uVar36 = 0x100;
  iVar26 = 1;
LAB_0010f37d:
  lVar33 = local_c0 + uVar18;
  uVar8 = 0;
  if (-1 < lVar33) {
    uVar8 = uVar17;
  }
  local_c0 = lVar33 - uVar8;
  uVar8 = (-1 < lVar33) + uVar9;
  uVar38 = lVar14 + iVar15;
  goto LAB_0010f0f2;
}

Assistant:

void RasterizerA3<N>::_addLine(Fixed x0, Fixed y0, Fixed x1, Fixed y1) noexcept {
  Fixed dx = x1 - x0;
  Fixed dy = y1 - y0;

  if (dy == Fixed(0))
    return;

  int cover = int(dy);
  int area;

  if (dx < 0) dx = -dx;
  if (dy < 0) dy = -dy;

  int yInc = 1;
  int coverSign = 1;

  // Fix RIGHT-TO-LEFT direction:
  //   - swap coordinates,
  //   - invert cover-sign.
  if (x0 > x1) {
    std::swap(x0, x1);
    std::swap(y0, y1);
    coverSign = -coverSign;
  }

  // Fix BOTTOM-TO-TOP direction:
  //   - invert fractional parts of y0 and y1,
  //   - invert cover-sign.
  if (y0 > y1) {
    y0 ^= kA8Mask;
    y0 += int(y0 & kA8Mask) == kA8Mask ? 1 - kA8Scale * 2 : 1;
    y1  = y0 + dy;

    yInc = -1;
    coverSign = -coverSign;
  }

  // Extract the raster and fractional coordinates.
  int ex0 = int(x0 >> kA8Shift);
  int fx0 = int(x0 & kA8Mask);

  int ey0 = int(y0 >> kA8Shift);
  int fy0 = int(y0 & kA8Mask);

  int ex1 = int(x1 >> kA8Shift);
  int fy1 = int(y1 & kA8Mask);

  // NOTE: Variable `i` is just a loop counter. We need to make sure to handle
  // the start and end points of the line, which use the same loop body, but
  // require special handling.
  //
  //   - `i` - How many Y iterations to do now.
  //   - `j` - How many Y iterations to do next.
  int i = 1;
  int j = int(y1 >> kA8Shift) - ey0;

  // Single-Cell.
  if ((j | ((fx0 + int(dx)) > 256)) == 0) {
    _yBounds.union_(ey0, ey0);
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);

    _mergeCell(ex0, ey0, cover, (fx0 * 2 + int(dx)) * cover);
    return;
  }

  uint32_t ey1 = ey0 + (j + (fy1 != 0)) * yInc;
  if (ey0 <= ey1)
    _yBounds.union_(ey0, ey1);
  else
    _yBounds.union_(ey1, ey0);

  // Strictly horizontal line (always one cell per scanline).
  if (dx == 0) {
    if (j > 0)
      cover = (kA8Scale - fy0) * coverSign;

    fy0  = coverSign << kA8Shift;
    fy1 *= coverSign;
    fx0 *= 2;

    size_t bitIndex = ex0 / kPixelsPerOneBit;
    BitWord* bitBase = _bits + (bitIndex / kBitWordBits);
    BitWord bitMask = BitWord(1) << (bitIndex % kBitWordBits);

    for (;;) {
      area = fx0 * cover;
      do {
        bitBase[ey0 * _bitStride] |= bitMask;
        _mergeCell(ex0, ey0, cover, area);
        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      cover = fy1;
      i = j;
      j = 1;

      if (i <= 1)
        continue;

      cover = fy0;
      i--;
    }

    return;
  }

  Fixed xErr = -dy / 2, xBase, xLift, xRem, xDlt = dx;
  Fixed yErr = -dx / 2, yBase, yLift, yRem, yDlt = dy;

  xBase = dx * kA8Scale;
  xLift = xBase / dy;
  xRem  = xBase % dy;

  yBase = dy * kA8Scale;
  yLift = yBase / dx;
  yRem  = yBase % dx;

  if (j != 0) {
    Fixed p = Fixed(kA8Scale - fy0) * dx;
    xDlt  = p / dy;
    xErr += p % dy;
    fy1 = kA8Scale;
  }

  if (ex0 != ex1) {
    Fixed p = Fixed(kA8Scale - fx0) * dy;
    yDlt = p / dx;
    yErr += p % dx;
  }

  // Vertical direction -> One/Two cells per scanline.
  if (dy >= dx) {
    int yAcc = int(y0) + int(yDlt);

    goto VertSkip;
    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

VertSkip:
        area = fx0;
        fx0 += int(xDlt);

        if (fx0 <= 256) {
          cover = (fy1 - fy0) * coverSign;
          area  = (area + fx0) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

          if (fx0 == 256) {
            ex0++;
            fx0 = 0;
            goto VertAdvance;
          }
        }
        else {
          yAcc &= 0xFF;
          fx0  &= kA8Mask;

          cover = (yAcc - fy0) * coverSign;
          area  = (area + kA8Scale) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);
          ex0++;

          cover = (fy1 - yAcc) * coverSign;
          area  = fx0 * cover;
          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

VertAdvance:
          yAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; yAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      i = j;
      j = 1;

      if (i > 1) {
        fy0 = 0;
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy0 = 0;
        fy1 = int(y1 & kA8Mask);

        xDlt = x1 - (ex0 << 8) - fx0;
        goto VertSkip;
      }
    }

    return;
  }
  // Horizontal direction -> Two or more cells per scanline.
  else {
    int fx1;
    int coverAcc = fy0;

    cover = int(yDlt);
    coverAcc += cover;

    if (j != 0)
      fy1 = kA8Scale;

    if (fx0 + int(xDlt) > 256)
      goto HorzInside;

    x0 += xDlt;

    cover = (fy1 - fy0) * coverSign;
    area = (fx0 * 2 + int(xDlt)) * cover;

HorzSingle:
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
    _mergeCell(ex0, ey0, cover, area);

    ey0 += yInc;
    if (ey0 == ey1)
      return;

    if (fx0 + int(xDlt) == 256) {
      coverAcc += int(yLift);
      yErr += yRem;
      if (yErr >= 0) { yErr -= dx; coverAcc++; }
    }

    if (--i == 0)
      goto HorzAfter;

    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

HorzSkip:
        coverAcc -= 256;
        cover = coverAcc;
        assert(cover >= 0 && cover <= 256);

HorzInside:
        x0 += xDlt;

        ex1 = int(x0 >> kA8Shift);
        fx1 = int(x0 & kA8Mask);
        assert(ex0 != ex1);

        if (fx1 == 0)
          fx1 = kA8Scale;
        else
          ex1++;

        area = (fx0 + kA8Scale) * cover;
        IntUtils::bitVectorFill(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, (ex1 / kPixelsPerOneBit) - (ex0 / kPixelsPerOneBit) + 1);

        while (ex0 != ex1 - 1) {
          _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

          cover = int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; cover++; }

          coverAcc += cover;
          area  = kA8Scale * cover;

          ex0++;
        }

        cover += fy1 - coverAcc;
        area   = fx1 * cover;
        _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

        if (fx1 == kA8Scale) {
          coverAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; coverAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

HorzAfter:
      i = j;
      j = 1;

      if (i > 1) {
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy1 = int(y1 & kA8Mask);
        xDlt = x1 - x0;

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

        if (fx0 + int(xDlt) <= 256) {
          cover = fy1 * coverSign;
          area = (fx0 * 2 + int(xDlt)) * cover;
          goto HorzSingle;
        }
        else {
          goto HorzSkip;
        }
      }
    }

    return;
  }
}